

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_collection_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::TrustStoreCollectionTest::~TrustStoreCollectionTest
          (TrustStoreCollectionTest *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TrustStoreCollectionTest_006d91f8;
  p_Var1 = (this->newintermediate_).
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->oldintermediate_).
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->target_).
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->newrootrollover_).
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->newroot_).
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->oldroot_).
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    ParsedCertificateList chain;
    ASSERT_TRUE(ReadCertChainFromFile(
        "testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem",
        &chain));

    ASSERT_EQ(3U, chain.size());
    target_ = chain[0];
    oldintermediate_ = chain[1];
    oldroot_ = chain[2];
    ASSERT_TRUE(target_);
    ASSERT_TRUE(oldintermediate_);
    ASSERT_TRUE(oldroot_);

    ASSERT_TRUE(
        ReadCertChainFromFile("testdata/verify_certificate_chain_unittest/"
                              "key-rollover/longrolloverchain.pem",
                              &chain));

    ASSERT_EQ(5U, chain.size());
    newintermediate_ = chain[1];
    newroot_ = chain[2];
    newrootrollover_ = chain[3];
    ASSERT_TRUE(newintermediate_);
    ASSERT_TRUE(newroot_);
    ASSERT_TRUE(newrootrollover_);
  }